

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O2

_Bool similar_signatures(char *sig1,char *sig2)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (lVar5 == 0x51) break;
    iVar3 = base64_decode(sig1[lVar5]);
    iVar4 = base64_decode(sig2[lVar5]);
    uVar6 = iVar3 - iVar4;
    uVar1 = -uVar6;
    if (0 < (int)uVar6) {
      uVar1 = uVar6;
    }
    lVar2 = lVar5 + 1;
  } while (uVar1 < 2);
  return lVar5 == 0x51;
}

Assistant:

static bool similar_signatures(char const sig1[SIG_LEN], char const sig2[SIG_LEN])
{
   int correct = 0;
   int i;

   for (i = 0; i < SIG_LEN; i++) {
      int q1 = base64_decode(sig1[i]);
      int q2 = base64_decode(sig2[i]);

      /* A difference of one quantisation level could be because two values
       * which were originally close by straddled a quantisation boundary.
       * A difference of two quantisation levels is a significant deviation.
       */
      if (abs(q1 - q2) > 1)
         return false;

      correct++;
   }

   return ((float)correct / SIG_LEN) > 0.95;
}